

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int getPid(QString *package)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  initializer_list<QString> args;
  QAnyStringView QVar5;
  QArrayDataPointer<QString> local_e8;
  QArrayDataPointer<char> local_c8;
  QArrayDataPointer<QByteArray> local_a8;
  bool ok;
  char *local_80;
  QArrayDataPointer<QByteArray> local_68;
  undefined1 local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char *)0x0;
  local_c8.size = 0;
  local_e8.size = -0x5555555555555556;
  local_e8.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_e8.ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  latin1.m_data = "shell";
  latin1.m_size = 5;
  QString::QString((QString *)&local_68,latin1);
  local_a8.ptr = (QByteArray *)(package->d).ptr;
  local_a8.size = (package->d).size | 0x8000000000000000;
  _ok = &local_a8;
  local_a8.d = (Data *)CONCAT71(local_a8.d._1_7_,1);
  local_80 = (char *)0x0;
  QVar5.m_size = (size_t)"ps | grep \' %1\'";
  QVar5.field_0.m_data = local_50;
  QtPrivate::argToQString(QVar5,0x400000000000000f,(ArgBase **)0x1);
  args._M_len = 2;
  args._M_array = (iterator)&local_68;
  QList<QString>::QList((QList<QString> *)&local_e8,args);
  lVar4 = 0x18;
  do {
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)((long)&local_68.d + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  iVar3 = 0;
  bVar1 = execAdbCommand((QStringList *)&local_e8,(QByteArray *)&local_c8,false);
  if (bVar1) {
    local_68.size = -0x5555555555555556;
    local_68.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_68.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
    QByteArray::split((char)&local_68);
    if (local_68.size == 0) {
      iVar3 = 0;
    }
    else {
      local_a8.size = 0xaaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_a8.ptr = (QByteArray *)0xaaaaaaaaaaaaaaaa;
      QByteArray::simplified_helper((QByteArray *)&ok);
      QByteArray::replace((char)(QArrayDataPointer<char> *)&ok,'\t');
      QByteArray::split((char)&local_a8);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&ok);
      iVar3 = 0;
      if (2 < (ulong)local_a8.size) {
        _ok = (QArrayDataPointer<QByteArray> *)((ulong)_ok & 0xffffffffffffff00);
        iVar2 = QByteArray::toInt((bool *)(local_a8.ptr + 1),(int)&ok);
        iVar3 = -1;
        if (ok != false) {
          iVar3 = iVar2;
        }
      }
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_a8);
    }
    QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_68);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int getPid(const QString &package)
{
    QByteArray output;
    const QStringList psArgs = { "shell"_L1, "ps | grep ' %1'"_L1.arg(package) };
    if (!execAdbCommand(psArgs, &output, false))
        return false;

    const QList<QByteArray> lines = output.split(u'\n');
    if (lines.size() < 1)
        return false;

    QList<QByteArray> columns = lines.first().simplified().replace(u'\t', u' ').split(u' ');
    if (columns.size() < 3)
        return false;

    bool ok = false;
    int pid = columns.at(1).toInt(&ok);
    if (ok)
        return pid;

    return -1;
}